

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::ObjectIntersector1<false>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Scene *pSVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  byte bVar10;
  int iVar11;
  ulong uVar12;
  _func_int **pp_Var13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong unaff_R14;
  size_t mask;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  float fVar33;
  undefined1 auVar34 [64];
  undefined4 uVar35;
  undefined8 uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  float fVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 in_ZMM18 [64];
  int mask_1;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_2504;
  RayQueryContext *local_2500;
  ulong local_24f8;
  ulong local_24f0;
  ulong local_24e8;
  ulong local_24e0;
  ulong local_24d8;
  ulong local_24d0;
  ulong *local_24c8;
  RTCIntersectFunctionNArguments local_24c0;
  Geometry *local_2490;
  undefined8 local_2488;
  RTCIntersectArguments *local_2480;
  undefined1 local_2478 [32];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2370[0] = 0;
    if (local_2378 != 8) {
      aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
      auVar5 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3])
                         );
      auVar6 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar22._8_4_ = 0x7fffffff;
      auVar22._0_8_ = 0x7fffffff7fffffff;
      auVar22._12_4_ = 0x7fffffff;
      auVar22 = vandps_avx512vl((undefined1  [16])aVar2,auVar22);
      auVar37._8_4_ = 0x219392ef;
      auVar37._0_8_ = 0x219392ef219392ef;
      auVar37._12_4_ = 0x219392ef;
      local_24c8 = local_2368;
      uVar15 = vcmpps_avx512vl(auVar22,auVar37,1);
      bVar4 = (bool)((byte)uVar15 & 1);
      auVar23._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.x;
      bVar4 = (bool)((byte)(uVar15 >> 1) & 1);
      auVar23._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.y;
      bVar4 = (bool)((byte)(uVar15 >> 2) & 1);
      auVar23._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.z;
      bVar4 = (bool)((byte)(uVar15 >> 3) & 1);
      auVar23._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * aVar2.field_3.a;
      auVar22 = vrcp14ps_avx512vl(auVar23);
      auVar24._8_4_ = 0x3f800000;
      auVar24._0_8_ = &DAT_3f8000003f800000;
      auVar24._12_4_ = 0x3f800000;
      auVar24 = vfnmadd213ps_avx512vl(auVar23,auVar22,auVar24);
      auVar23 = vfmadd132ps_fma(auVar24,auVar22,auVar22);
      fVar33 = auVar23._0_4_;
      local_23b8._4_4_ = fVar33;
      local_23b8._0_4_ = fVar33;
      local_23b8._8_4_ = fVar33;
      local_23b8._12_4_ = fVar33;
      local_23b8._16_4_ = fVar33;
      local_23b8._20_4_ = fVar33;
      local_23b8._24_4_ = fVar33;
      local_23b8._28_4_ = fVar33;
      auVar43 = ZEXT3264(local_23b8);
      auVar22 = vmovshdup_avx(auVar23);
      uVar36 = auVar22._0_8_;
      local_23d8._8_8_ = uVar36;
      local_23d8._0_8_ = uVar36;
      local_23d8._16_8_ = uVar36;
      local_23d8._24_8_ = uVar36;
      auVar44 = ZEXT3264(local_23d8);
      auVar24 = vshufpd_avx(auVar23,auVar23,1);
      auVar38._8_4_ = 2;
      auVar38._0_8_ = 0x200000002;
      auVar38._12_4_ = 2;
      auVar38._16_4_ = 2;
      auVar38._20_4_ = 2;
      auVar38._24_4_ = 2;
      auVar38._28_4_ = 2;
      fVar39 = fVar33 * (ray->super_RayK<1>).org.field_0.m128[0];
      local_23f8 = vpermps_avx2(auVar38,ZEXT1632(auVar23));
      auVar45 = ZEXT3264(local_23f8);
      auVar25._8_4_ = 1;
      auVar25._0_8_ = 0x100000001;
      auVar25._12_4_ = 1;
      auVar25._16_4_ = 1;
      auVar25._20_4_ = 1;
      auVar25._24_4_ = 1;
      auVar25._28_4_ = 1;
      auVar40 = ZEXT1632(CONCAT412(auVar23._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                   CONCAT48(auVar23._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2]
                                            ,CONCAT44(auVar23._4_4_ *
                                                      (ray->super_RayK<1>).org.field_0.m128[1],
                                                      fVar39))));
      auVar25 = vpermps_avx2(auVar25,auVar40);
      auVar38 = vpermps_avx2(auVar38,auVar40);
      local_24d0 = (ulong)(fVar33 < 0.0) << 5;
      local_24d8 = (ulong)(auVar22._0_4_ < 0.0) << 5 | 0x40;
      local_24e0 = (ulong)(auVar24._0_4_ < 0.0) << 5 | 0x80;
      local_24e8 = local_24d0 ^ 0x20;
      local_24f0 = local_24d8 ^ 0x20;
      local_24f8 = local_24e0 ^ 0x20;
      uVar35 = auVar6._0_4_;
      auVar34 = ZEXT3264(CONCAT428(uVar35,CONCAT424(uVar35,CONCAT420(uVar35,CONCAT416(uVar35,
                                                  CONCAT412(uVar35,CONCAT48(uVar35,CONCAT44(uVar35,
                                                  uVar35))))))));
      local_2418._0_8_ = CONCAT44(fVar39,fVar39) ^ 0x8000000080000000;
      local_2418._8_4_ = -fVar39;
      local_2418._12_4_ = -fVar39;
      local_2418._16_4_ = -fVar39;
      local_2418._20_4_ = -fVar39;
      local_2418._24_4_ = -fVar39;
      local_2418._28_4_ = -fVar39;
      auVar41 = ZEXT3264(local_2418);
      local_2438._0_8_ = auVar25._0_8_ ^ 0x8000000080000000;
      local_2438._8_4_ = auVar25._8_4_ ^ 0x80000000;
      local_2438._12_4_ = auVar25._12_4_ ^ 0x80000000;
      local_2438._16_4_ = auVar25._16_4_ ^ 0x80000000;
      local_2438._20_4_ = auVar25._20_4_ ^ 0x80000000;
      local_2438._24_4_ = auVar25._24_4_ ^ 0x80000000;
      local_2438._28_4_ = auVar25._28_4_ ^ 0x80000000;
      auVar42 = ZEXT3264(local_2438);
      local_2458._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
      local_2458._8_4_ = auVar38._8_4_ ^ 0x80000000;
      local_2458._12_4_ = auVar38._12_4_ ^ 0x80000000;
      local_2458._16_4_ = auVar38._16_4_ ^ 0x80000000;
      local_2458._20_4_ = auVar38._20_4_ ^ 0x80000000;
      local_2458._24_4_ = auVar38._24_4_ ^ 0x80000000;
      local_2458._28_4_ = auVar38._28_4_ ^ 0x80000000;
      auVar46 = ZEXT3264(local_2458);
      uVar35 = auVar5._0_4_;
      local_2478._4_4_ = uVar35;
      local_2478._0_4_ = uVar35;
      local_2478._8_4_ = uVar35;
      local_2478._12_4_ = uVar35;
      local_2478._16_4_ = uVar35;
      local_2478._20_4_ = uVar35;
      local_2478._24_4_ = uVar35;
      local_2478._28_4_ = uVar35;
      auVar48 = ZEXT3264(local_2478);
      auVar25 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
      auVar49 = ZEXT3264(auVar25);
      auVar25 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
      auVar50 = ZEXT3264(auVar25);
      uVar15 = local_24d0;
      uVar16 = local_24d8;
      uVar17 = local_24e0;
      uVar18 = local_24e8;
      uVar19 = local_24f8;
      uVar20 = local_24f0;
      local_2500 = context;
      do {
        do {
          if (local_24c8 == &local_2378) {
            return;
          }
          pfVar1 = (float *)(local_24c8 + -1);
          local_24c8 = local_24c8 + -2;
        } while ((ray->super_RayK<1>).tfar < *pfVar1);
        uVar21 = *local_24c8;
        do {
          auVar47 = auVar48._0_32_;
          auVar40 = auVar46._0_32_;
          auVar38 = auVar42._0_32_;
          auVar25 = auVar41._0_32_;
          if ((uVar21 & 8) == 0) {
            auVar5 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar21 + 0x40 + uVar15),auVar25,
                                     auVar43._0_32_);
            auVar6 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar21 + 0x40 + uVar16),auVar38,
                                     auVar44._0_32_);
            auVar29 = vpmaxsd_avx2(ZEXT1632(auVar5),ZEXT1632(auVar6));
            auVar5 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar21 + 0x40 + uVar17),auVar40,
                                     auVar45._0_32_);
            auVar7 = vpmaxsd_avx2(ZEXT1632(auVar5),auVar47);
            auVar26 = vpmaxsd_avx512vl(auVar29,auVar7);
            in_ZMM18 = ZEXT3264(auVar26);
            auVar5 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar21 + 0x40 + uVar18),auVar25,
                                     auVar43._0_32_);
            auVar6 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar21 + 0x40 + uVar20),auVar38,
                                     auVar44._0_32_);
            auVar29 = vpminsd_avx2(ZEXT1632(auVar5),ZEXT1632(auVar6));
            auVar5 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar21 + 0x40 + uVar19),auVar40,
                                     auVar45._0_32_);
            auVar7 = vpminsd_avx2(ZEXT1632(auVar5),auVar34._0_32_);
            auVar29 = vpminsd_avx2(auVar29,auVar7);
            uVar36 = vpcmpd_avx512vl(auVar26,auVar29,2);
            unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),(uint)(byte)uVar36);
          }
          if ((uVar21 & 8) == 0) {
            if (unaff_R14 == 0) {
              iVar11 = 4;
            }
            else {
              auVar29 = *(undefined1 (*) [32])(uVar21 & 0xfffffffffffffff0);
              auVar7 = ((undefined1 (*) [32])(uVar21 & 0xfffffffffffffff0))[1];
              auVar26 = vmovdqa64_avx512vl(auVar49._0_32_);
              auVar32 = in_ZMM18._0_32_;
              auVar26 = vpternlogd_avx512vl(auVar26,auVar32,auVar50._0_32_,0xf8);
              uVar21 = unaff_R14 & 0xffffffff;
              auVar27 = vpcompressd_avx512vl(auVar26);
              bVar4 = (bool)((byte)uVar21 & 1);
              auVar31._0_4_ = (uint)bVar4 * auVar27._0_4_ | (uint)!bVar4 * auVar26._0_4_;
              bVar4 = (bool)((byte)(uVar21 >> 1) & 1);
              auVar31._4_4_ = (uint)bVar4 * auVar27._4_4_ | (uint)!bVar4 * auVar26._4_4_;
              bVar4 = (bool)((byte)(uVar21 >> 2) & 1);
              auVar31._8_4_ = (uint)bVar4 * auVar27._8_4_ | (uint)!bVar4 * auVar26._8_4_;
              bVar4 = (bool)((byte)(uVar21 >> 3) & 1);
              auVar31._12_4_ = (uint)bVar4 * auVar27._12_4_ | (uint)!bVar4 * auVar26._12_4_;
              bVar4 = (bool)((byte)(uVar21 >> 4) & 1);
              auVar31._16_4_ = (uint)bVar4 * auVar27._16_4_ | (uint)!bVar4 * auVar26._16_4_;
              bVar4 = (bool)((byte)(uVar21 >> 5) & 1);
              auVar31._20_4_ = (uint)bVar4 * auVar27._20_4_ | (uint)!bVar4 * auVar26._20_4_;
              bVar4 = (bool)((byte)(uVar21 >> 6) & 1);
              auVar31._24_4_ = (uint)bVar4 * auVar27._24_4_ | (uint)!bVar4 * auVar26._24_4_;
              bVar4 = (bool)((byte)(uVar21 >> 7) & 1);
              auVar31._28_4_ = (uint)bVar4 * auVar27._28_4_ | (uint)!bVar4 * auVar26._28_4_;
              auVar26 = vpermt2q_avx512vl(auVar29,auVar31,auVar7);
              uVar21 = auVar26._0_8_;
              iVar11 = 0;
              uVar12 = unaff_R14 - 1 & unaff_R14;
              if (uVar12 != 0) {
                auVar26 = vpshufd_avx2(auVar31,0x55);
                vpermt2q_avx512vl(auVar29,auVar26,auVar7);
                auVar27 = vpminsd_avx2(auVar31,auVar26);
                auVar26 = vpmaxsd_avx2(auVar31,auVar26);
                uVar12 = uVar12 - 1 & uVar12;
                if (uVar12 == 0) {
                  auVar25 = vpermi2q_avx512vl(auVar27,auVar29,auVar7);
                  uVar21 = auVar25._0_8_;
                  auVar25 = vpermt2q_avx512vl(auVar29,auVar26,auVar7);
                  *local_24c8 = auVar25._0_8_;
                  auVar25 = vpermd_avx512vl(auVar26,auVar32);
                  *(int *)(local_24c8 + 1) = auVar25._0_4_;
                  local_24c8 = local_24c8 + 2;
                }
                else {
                  auVar9 = vpshufd_avx2(auVar31,0xaa);
                  vpermt2q_avx512vl(auVar29,auVar9,auVar7);
                  auVar8 = vpminsd_avx2(auVar27,auVar9);
                  auVar27 = vpmaxsd_avx2(auVar27,auVar9);
                  auVar9 = vpminsd_avx2(auVar26,auVar27);
                  auVar26 = vpmaxsd_avx2(auVar26,auVar27);
                  uVar12 = uVar12 - 1 & uVar12;
                  if (uVar12 == 0) {
                    auVar25 = vpermi2q_avx512vl(auVar8,auVar29,auVar7);
                    uVar21 = auVar25._0_8_;
                    auVar25 = vpermt2q_avx512vl(auVar29,auVar26,auVar7);
                    *local_24c8 = auVar25._0_8_;
                    auVar25 = vpermd_avx512vl(auVar26,auVar32);
                    *(int *)(local_24c8 + 1) = auVar25._0_4_;
                    auVar25 = vpermt2q_avx512vl(auVar29,auVar9,auVar7);
                    local_24c8[2] = auVar25._0_8_;
                    auVar25 = vpermd_avx512vl(auVar9,auVar32);
                    *(int *)(local_24c8 + 3) = auVar25._0_4_;
                    local_24c8 = local_24c8 + 4;
                  }
                  else {
                    auVar28 = vmovdqa64_avx512vl(auVar32);
                    auVar27 = vpshufd_avx2(auVar31,0xff);
                    vpermt2q_avx512vl(auVar29,auVar27,auVar7);
                    auVar32 = vpminsd_avx2(auVar8,auVar27);
                    auVar27 = vpmaxsd_avx2(auVar8,auVar27);
                    auVar8 = vpminsd_avx2(auVar9,auVar27);
                    auVar27 = vpmaxsd_avx2(auVar9,auVar27);
                    auVar9 = vpminsd_avx2(auVar26,auVar27);
                    auVar26 = vpmaxsd_avx2(auVar26,auVar27);
                    uVar12 = uVar12 - 1 & uVar12;
                    iVar11 = 0;
                    if (uVar12 == 0) {
                      auVar27 = vpermi2q_avx512vl(auVar32,auVar29,auVar7);
                      uVar21 = auVar27._0_8_;
                      auVar27 = vpermt2q_avx512vl(auVar29,auVar26,auVar7);
                      *local_24c8 = auVar27._0_8_;
                      auVar27 = vmovdqa64_avx512vl(auVar28);
                      in_ZMM18 = ZEXT3264(auVar27);
                      auVar26 = vpermd_avx512vl(auVar26,auVar28);
                      *(int *)(local_24c8 + 1) = auVar26._0_4_;
                      auVar26 = vpermt2q_avx512vl(auVar29,auVar9,auVar7);
                      local_24c8[2] = auVar26._0_8_;
                      auVar26 = vpermd_avx512vl(auVar9,auVar28);
                      *(int *)(local_24c8 + 3) = auVar26._0_4_;
                      auVar29 = vpermt2q_avx512vl(auVar29,auVar8,auVar7);
                      local_24c8[4] = auVar29._0_8_;
                      auVar29 = vpermd_avx512vl(auVar8,auVar28);
                      *(int *)(local_24c8 + 5) = auVar29._0_4_;
                      local_24c8 = local_24c8 + 6;
                      auVar41 = ZEXT3264(auVar25);
                      auVar42 = ZEXT3264(auVar38);
                      auVar46 = ZEXT3264(auVar40);
                      auVar48 = ZEXT3264(auVar47);
                    }
                    else {
                      auVar30 = valignd_avx512vl(auVar31,auVar31,3);
                      auVar27 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                      auVar31 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                     CONCAT48(0x80000000,
                                                                              0x8000000080000000))),
                                                  auVar27,auVar32);
                      auVar27 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                      auVar31 = vpermt2d_avx512vl(auVar31,auVar27,auVar8);
                      auVar31 = vpermt2d_avx512vl(auVar31,auVar27,auVar9);
                      auVar27 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                      auVar26 = vpermt2d_avx512vl(auVar31,auVar27,auVar26);
                      auVar41 = ZEXT3264(auVar26);
                      uVar21 = uVar12;
                      do {
                        auVar27 = auVar41._0_32_;
                        auVar26._8_4_ = 1;
                        auVar26._0_8_ = 0x100000001;
                        auVar26._12_4_ = 1;
                        auVar26._16_4_ = 1;
                        auVar26._20_4_ = 1;
                        auVar26._24_4_ = 1;
                        auVar26._28_4_ = 1;
                        auVar26 = vpermd_avx2(auVar26,auVar30);
                        auVar30 = valignd_avx512vl(auVar30,auVar30,1);
                        vpermt2q_avx512vl(auVar29,auVar30,auVar7);
                        uVar21 = uVar21 - 1 & uVar21;
                        uVar36 = vpcmpd_avx512vl(auVar26,auVar27,5);
                        auVar26 = vpmaxsd_avx2(auVar26,auVar27);
                        bVar10 = (byte)uVar36 << 1;
                        auVar27 = valignd_avx512vl(auVar27,auVar27,7);
                        bVar4 = (bool)((byte)uVar36 & 1);
                        auVar32._4_4_ = (uint)bVar4 * auVar27._4_4_ | (uint)!bVar4 * auVar26._4_4_;
                        auVar32._0_4_ = auVar26._0_4_;
                        bVar4 = (bool)(bVar10 >> 2 & 1);
                        auVar32._8_4_ = (uint)bVar4 * auVar27._8_4_ | (uint)!bVar4 * auVar26._8_4_;
                        bVar4 = (bool)(bVar10 >> 3 & 1);
                        auVar32._12_4_ =
                             (uint)bVar4 * auVar27._12_4_ | (uint)!bVar4 * auVar26._12_4_;
                        bVar4 = (bool)(bVar10 >> 4 & 1);
                        auVar32._16_4_ =
                             (uint)bVar4 * auVar27._16_4_ | (uint)!bVar4 * auVar26._16_4_;
                        bVar4 = (bool)(bVar10 >> 5 & 1);
                        auVar32._20_4_ =
                             (uint)bVar4 * auVar27._20_4_ | (uint)!bVar4 * auVar26._20_4_;
                        bVar4 = (bool)(bVar10 >> 6 & 1);
                        auVar32._24_4_ =
                             (uint)bVar4 * auVar27._24_4_ | (uint)!bVar4 * auVar26._24_4_;
                        auVar32._28_4_ =
                             (uint)(bVar10 >> 7) * auVar27._28_4_ |
                             (uint)!(bool)(bVar10 >> 7) * auVar26._28_4_;
                        auVar41 = ZEXT3264(auVar32);
                      } while (uVar21 != 0);
                      lVar14 = POPCOUNT(uVar12) + 3;
                      do {
                        auVar26 = vpermi2q_avx512vl(auVar32,auVar29,auVar7);
                        *local_24c8 = auVar26._0_8_;
                        auVar27 = auVar41._0_32_;
                        auVar26 = vpermd_avx512vl(auVar27,auVar28);
                        *(int *)(local_24c8 + 1) = auVar26._0_4_;
                        auVar32 = valignd_avx512vl(auVar27,auVar27,1);
                        local_24c8 = local_24c8 + 2;
                        auVar41 = ZEXT3264(auVar32);
                        lVar14 = lVar14 + -1;
                      } while (lVar14 != 0);
                      auVar29 = vpermt2q_avx512vl(auVar29,auVar32,auVar7);
                      uVar21 = auVar29._0_8_;
                      auVar41 = ZEXT3264(auVar25);
                      auVar42 = ZEXT3264(auVar38);
                      auVar46 = ZEXT3264(auVar40);
                      auVar48 = ZEXT3264(auVar47);
                      auVar25 = vmovdqa64_avx512vl(auVar28);
                      in_ZMM18 = ZEXT3264(auVar25);
                    }
                  }
                }
              }
            }
          }
          else {
            iVar11 = 6;
          }
        } while (iVar11 == 0);
        if (iVar11 == 6) {
          uVar15 = (ulong)((uint)uVar21 & 0xf);
          if (uVar15 != 8) {
            pSVar3 = local_2500->scene;
            lVar14 = 0;
            local_2398 = vmovdqu64_avx512vl(in_ZMM18._0_32_);
            do {
              local_24c0.geomID = *(uint *)((uVar21 & 0xfffffffffffffff0) + lVar14 * 8);
              local_2490 = (pSVar3->geometries).items[local_24c0.geomID].ptr;
              if (((ray->super_RayK<1>).mask & local_2490->mask) != 0) {
                local_24c0.primID = *(uint *)((uVar21 & 0xfffffffffffffff0) + 4 + lVar14 * 8);
                local_2504 = -1;
                local_24c0.valid = &local_2504;
                local_24c0.geometryUserPtr = local_2490->userPtr;
                local_24c0.context = local_2500->user;
                local_24c0.N = 1;
                local_2488 = 0;
                local_2480 = local_2500->args;
                pp_Var13 = (_func_int **)local_2480->intersect;
                if (pp_Var13 == (_func_int **)0x0) {
                  pp_Var13 = local_2490[1].super_RefCount._vptr_RefCount;
                }
                local_24c0.rayhit = (RTCRayHitN *)ray;
                (*(code *)pp_Var13)(&local_24c0);
                auVar43 = ZEXT3264(local_23b8);
                auVar44 = ZEXT3264(local_23d8);
                auVar45 = ZEXT3264(local_23f8);
                auVar41 = ZEXT3264(local_2418);
                auVar42 = ZEXT3264(local_2438);
                auVar46 = ZEXT3264(local_2458);
                auVar48 = ZEXT3264(local_2478);
                auVar25 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                auVar49 = ZEXT3264(auVar25);
                auVar25 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                auVar50 = ZEXT3264(auVar25);
                auVar25 = vmovdqu64_avx512vl(local_2398);
                in_ZMM18 = ZEXT3264(auVar25);
              }
              lVar14 = lVar14 + 1;
            } while (uVar15 - 8 != lVar14);
          }
          fVar33 = (ray->super_RayK<1>).tfar;
          auVar34 = ZEXT3264(CONCAT428(fVar33,CONCAT424(fVar33,CONCAT420(fVar33,CONCAT416(fVar33,
                                                  CONCAT412(fVar33,CONCAT48(fVar33,CONCAT44(fVar33,
                                                  fVar33))))))));
          uVar15 = local_24d0;
          uVar16 = local_24d8;
          uVar17 = local_24e0;
          uVar18 = local_24e8;
          uVar19 = local_24f8;
          uVar20 = local_24f0;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }